

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviewer.cpp
# Opt level: O2

bool __thiscall GraphViewer::setEdgeDashed(GraphViewer *this,int k,bool dashed)

{
  Connection *this_00;
  bool bVar1;
  char *pcVar2;
  undefined7 in_register_00000011;
  string str;
  char buff [200];
  allocator local_129;
  string local_128;
  string local_108 [32];
  char local_e8 [208];
  
  pcVar2 = "false";
  if ((int)CONCAT71(in_register_00000011,dashed) != 0) {
    pcVar2 = "true";
  }
  sprintf(local_e8,"setEdgeDashed %d %s\n",k,pcVar2);
  std::__cxx11::string::string(local_108,local_e8,&local_129);
  this_00 = this->con;
  std::__cxx11::string::string((string *)&local_128,local_108);
  bVar1 = Connection::sendMsg(this_00,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string(local_108);
  return bVar1;
}

Assistant:

bool GraphViewer::setEdgeDashed(int k, bool dashed) {
	char buff[200];
	sprintf(buff, "setEdgeDashed %d %s\n", k, dashed? "true" : "false");
	string str(buff);
	return con->sendMsg(str);
}